

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  float *scanline;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar6;
  stbtt__point sVar3;
  stbtt__point sVar4;
  undefined4 uVar7;
  undefined8 uVar5;
  stbtt_uint8 sVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 uVar19;
  stbtt_uint8 *data;
  stbrp_rect *psVar15;
  undefined6 uVar20;
  undefined4 uVar21;
  stbtt_packedchar *psVar16;
  undefined4 uVar22;
  ImFontConfig *pIVar17;
  ImFont *font;
  stbtt_packedchar *psVar18;
  short sVar23;
  short sVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined4 uVar34;
  undefined4 uVar35;
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [13];
  undefined1 auVar40 [14];
  unkbyte10 Var41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [15];
  uint6 uVar44;
  stbtt_packedchar *psVar45;
  unsigned_short uVar46;
  unsigned_short uVar47;
  unsigned_short uVar48;
  unsigned_short uVar49;
  stbtt_uint32 sVar50;
  int iVar57;
  int iVar58;
  int iVar59;
  undefined4 extraout_EAX;
  stbtt__active_edge *z;
  stbtt_uint32 sVar51;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  stbtt_uint32 sVar55;
  stbtt_uint32 sVar56;
  ImFontBuildDstData *pIVar60;
  long lVar61;
  uint *puVar62;
  stbrp_context *ptr;
  uchar *puVar63;
  ulong uVar64;
  void *ptr_00;
  stbtt__edge *p;
  stbtt__edge *psVar65;
  float *scanline_00;
  undefined8 *puVar66;
  stbtt__active_edge *psVar67;
  stbtt_uint32 *psVar68;
  ushort uVar69;
  int output_i;
  int iVar70;
  long lVar71;
  ImWchar *pIVar72;
  ImVector<unsigned_int> *pIVar73;
  ushort *puVar74;
  ulong uVar75;
  ulong uVar76;
  stbtt__active_edge *psVar77;
  long lVar78;
  float *pfVar79;
  int x;
  int iVar80;
  ImFontBuildSrcData *pIVar81;
  int *piVar82;
  ImFontBuildSrcData *pIVar83;
  stbtt_uint32 encoding_record;
  uint uVar84;
  byte *pbVar85;
  stbtt__edge *psVar86;
  long lVar87;
  uchar *puVar88;
  ImFontConfig *pIVar89;
  ulong uVar90;
  byte *pbVar91;
  int iVar92;
  ulong uVar93;
  stbtt__active_edge *psVar94;
  ImFontAtlas *pIVar95;
  ImU32 *it;
  ulong uVar96;
  uint *puVar97;
  ImU32 mask;
  uint uVar98;
  long lVar99;
  ImVector<unsigned_int> *pIVar100;
  uchar *puVar101;
  stbrp_node *psVar102;
  uint codepoint;
  stbtt__active_edge *psVar103;
  uchar *puVar104;
  bool bVar105;
  char cVar112;
  float sum;
  float fVar106;
  float fVar107;
  undefined4 uVar115;
  int iVar116;
  undefined4 uVar118;
  undefined1 auVar108 [16];
  char cVar114;
  ushort uVar113;
  undefined1 extraout_var [12];
  short sVar117;
  undefined4 uVar119;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  stbtt__buf sVar135;
  float y0_2;
  undefined1 auStack_4e4 [12];
  int local_4c0;
  int y1;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  ImFontAtlas *local_4a8;
  stbtt_uint32 charstrings;
  undefined8 local_498;
  float fStack_490;
  float fStack_48c;
  stbrp_node *local_480;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  stbtt__point *local_460;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_454;
  int local_450;
  float local_44c;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  undefined8 *local_3c8;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context *local_368;
  long local_360;
  long local_358;
  ulong local_350;
  ImFontBuildSrcData *local_348;
  ulong local_340;
  ulong local_338;
  ulong local_330;
  float local_328;
  undefined4 uStack_324;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  ImFontConfig *local_318;
  long local_310;
  uchar *local_308;
  long local_300;
  size_t local_2f8;
  size_t local_2f0;
  ulong local_2e8;
  stbtt_packedchar *local_2e0;
  stbtt__edge *local_2d8;
  long local_2d0;
  uchar *local_2c8;
  int local_2c0;
  int x1_1;
  float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  int x0;
  undefined4 uStack_234;
  uint uStack_230;
  uint uStack_22c;
  
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  lVar61 = 0;
  local_4a8 = atlas;
  while( true ) {
    local_310 = (long)(local_4a8->ConfigData).Size;
    local_360 = lVar61;
    if (local_310 <= lVar61) break;
    pIVar81 = src_tmp_array.Data;
    pIVar89 = (local_4a8->ConfigData).Data + lVar61;
    src_tmp_array.Data[lVar61].DstIndex = -1;
    iVar57 = (local_4a8->Fonts).Size;
    lVar71 = 0;
    lVar99 = -1;
    while ((iVar58 = (int)lVar99, lVar71 < iVar57 && (iVar58 == -1))) {
      lVar99 = -1;
      if (pIVar89->DstFont == (local_4a8->Fonts).Data[lVar71]) {
        src_tmp_array.Data[lVar61].DstIndex = (int)lVar71;
        lVar99 = lVar71;
      }
      lVar71 = lVar71 + 1;
    }
    _y0_2 = pIVar89;
    if (iVar58 == -1) goto LAB_0017b7de;
    data = (stbtt_uint8 *)pIVar89->FontData;
    iVar57 = pIVar89->FontNo;
    sVar8 = *data;
    sVar56 = 0xffffffff;
    if (sVar8 == '\0') {
      bVar105 = data[1] == '\x01';
LAB_00178fbd:
      if ((bVar105) && (data[2] == '\0')) {
        bVar105 = data[3] == '\0';
LAB_00179028:
        if (bVar105) {
          sVar56 = -(uint)(iVar57 != 0);
        }
      }
    }
    else if (sVar8 == 't') {
      sVar8 = data[1];
      if (sVar8 == 'r') {
        if (data[2] == 'u') {
          bVar105 = data[3] == 'e';
          goto LAB_00179028;
        }
      }
      else if (sVar8 == 't') {
        if ((((data[2] == 'c') && (data[3] == 'f')) &&
            ((sVar50 = ttULONG(data + 4), sVar50 == 0x20000 || (sVar50 == 0x10000)))) &&
           (uVar84 = *(uint *)(data + 8),
           iVar57 < (int)(uVar84 >> 0x18 | (uVar84 & 0xff0000) >> 8 | (uVar84 & 0xff00) << 8 |
                         uVar84 << 0x18))) {
          sVar56 = ttULONG(data + (long)iVar57 * 4 + 0xc);
        }
      }
      else if ((sVar8 == 'y') && (data[2] == 'p')) {
        bVar105 = data[3] == '1';
        goto LAB_00179028;
      }
    }
    else if (sVar8 == 'O') {
      if ((data[1] == 'T') && (data[2] == 'T')) {
        bVar105 = data[3] == 'O';
        goto LAB_00179028;
      }
    }
    else if (sVar8 == '1') {
      bVar105 = data[1] == '\0';
      goto LAB_00178fbd;
    }
    pIVar81[lVar61].FontInfo.data = data;
    pIVar81[lVar61].FontInfo.fontstart = sVar56;
    pIVar83 = pIVar81 + lVar61;
    (pIVar83->FontInfo).cff.data = (uchar *)0x0;
    (pIVar83->FontInfo).cff.cursor = 0;
    (pIVar83->FontInfo).cff.size = 0;
    sVar50 = stbtt__find_table(data,sVar56,"cmap");
    sVar51 = stbtt__find_table(data,sVar56,"loca");
    pIVar81[lVar61].FontInfo.loca = sVar51;
    sVar52 = stbtt__find_table(data,sVar56,"head");
    local_4b8 = (ushort *)CONCAT44(local_4b8._4_4_,sVar52);
    pIVar81[lVar61].FontInfo.head = sVar52;
    sVar52 = stbtt__find_table(data,sVar56,"glyf");
    pIVar81[lVar61].FontInfo.glyf = sVar52;
    sVar53 = stbtt__find_table(data,sVar56,"hhea");
    pIVar81[lVar61].FontInfo.hhea = sVar53;
    sVar54 = stbtt__find_table(data,sVar56,"hmtx");
    pIVar81[lVar61].FontInfo.hmtx = sVar54;
    sVar55 = stbtt__find_table(data,sVar56,"kern");
    pIVar81[lVar61].FontInfo.kern = sVar55;
    local_498 = (ImVector<unsigned_int> *)CONCAT44(local_498._4_4_,sVar56);
    sVar56 = stbtt__find_table(data,sVar56,"GPOS");
    pIVar81[lVar61].FontInfo.gpos = sVar56;
    if ((((sVar50 == 0) || ((float)local_4b8 == 0.0)) || (sVar53 == 0)) || (sVar54 == 0))
    goto LAB_0017b7de;
    if (sVar52 == 0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar56 = stbtt__find_table(data,(stbtt_uint32)(float)local_498,"CFF ");
      if (sVar56 == 0) goto LAB_0017b7de;
      pIVar83 = pIVar81 + lVar61;
      (pIVar83->FontInfo).fdselect.data = (uchar *)0x0;
      (pIVar83->FontInfo).fdselect.cursor = 0;
      (pIVar83->FontInfo).fdselect.size = 0;
      pIVar83 = pIVar81 + lVar61;
      (pIVar83->FontInfo).fontdicts.data = (uchar *)0x0;
      (pIVar83->FontInfo).fontdicts.cursor = 0;
      (pIVar83->FontInfo).fontdicts.size = 0;
      pIVar81[lVar61].FontInfo.cff.data = data + sVar56;
      pIVar81[lVar61].FontInfo.cff.cursor = 0;
      pIVar81[lVar61].FontInfo.cff.size = 0x20000000;
      puVar63 = pIVar81[lVar61].FontInfo.cff.data;
      uVar34 = pIVar81[lVar61].FontInfo.cff.cursor;
      uVar35 = pIVar81[lVar61].FontInfo.cff.size;
      x0 = (int)puVar63;
      uStack_234 = (undefined4)((ulong)puVar63 >> 0x20);
      uVar84 = uVar34 + 2;
      if ((int)uVar35 < (int)(uVar34 + 2)) {
        uVar84 = uVar35;
      }
      if ((int)uVar34 < -2) {
        uVar84 = uVar35;
      }
      uStack_230 = 0;
      if ((int)uVar84 < (int)uVar35) {
        uStack_230 = (uint)puVar63[(int)uVar84];
      }
      if ((int)uVar35 < (int)uStack_230) {
        uStack_230 = uVar35;
      }
      uStack_22c = uVar35;
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar135 = stbtt__cff_get_index((stbtt__buf *)&x0);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar135,0);
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar135 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar81[lVar61].FontInfo.gsubrs = sVar135;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      uVar84 = uStack_22c;
      sVar135.data._4_4_ = uStack_234;
      sVar135.data._0_4_ = x0;
      sVar135.cursor = uStack_230;
      sVar135.size = uStack_22c;
      sVar135 = stbtt__get_subrs(sVar135,(stbtt__buf)buf_rects);
      iVar57 = y1;
      pIVar81[lVar61].FontInfo.subrs = sVar135;
      if ((buf_packedchars.Size != 2) || (sVar56 = charstrings, charstrings == 0))
      goto LAB_0017b7de;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_0017b7de;
        uStack_230 = fdarrayoff;
        if ((int)uVar84 < (int)fdarrayoff) {
          uStack_230 = uVar84;
        }
        if ((int)fdarrayoff < 0) {
          uStack_230 = uVar84;
        }
        sVar135 = stbtt__cff_get_index((stbtt__buf *)&x0);
        uVar84 = uStack_22c;
        pIVar81[lVar61].FontInfo.fontdicts = sVar135;
        sVar135 = stbtt__buf_range((stbtt__buf *)&x0,iVar57,uStack_22c - iVar57);
        pIVar81[lVar61].FontInfo.fdselect = sVar135;
      }
      uStack_230 = sVar56;
      if ((int)uVar84 < (int)sVar56) {
        uStack_230 = uVar84;
      }
      if ((int)sVar56 < 0) {
        uStack_230 = uVar84;
      }
      sVar135 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar81[lVar61].FontInfo.charstrings = sVar135;
    }
    else if (sVar51 == 0) goto LAB_0017b7de;
    sVar56 = stbtt__find_table(data,(stbtt_uint32)(float)local_498,"maxp");
    if (sVar56 == 0) {
      uVar84 = 0xffff;
    }
    else {
      uVar84 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar56 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar56 + 4) >> 8);
    }
    pIVar81[lVar61].FontInfo.numGlyphs = uVar84;
    pIVar81[lVar61].FontInfo.svg = -1;
    uVar69 = *(ushort *)(data + (ulong)sVar50 + 2);
    pIVar81[lVar61].FontInfo.index_map = 0;
    uVar96 = (ulong)(ushort)(uVar69 << 8 | uVar69 >> 8);
    uVar84 = sVar50 + 4;
    iVar57 = 0;
    while( true ) {
      bVar105 = uVar96 == 0;
      uVar96 = uVar96 - 1;
      if (bVar105) break;
      uVar69 = *(ushort *)(data + uVar84) << 8 | *(ushort *)(data + uVar84) >> 8;
      if ((uVar69 == 0) ||
         ((uVar69 == 3 &&
          ((uVar69 = *(ushort *)(data + (ulong)uVar84 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar84 + 2) >> 8, uVar69 == 10 || (uVar69 == 1))))))
      {
        sVar56 = ttULONG(data + (ulong)uVar84 + 4);
        iVar57 = sVar56 + sVar50;
        pIVar81[lVar61].FontInfo.index_map = iVar57;
      }
      uVar84 = uVar84 + 8;
    }
    if (iVar57 == 0) goto LAB_0017b7de;
    pIVar81[lVar61].FontInfo.indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(int)(float)local_4b8 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)(float)local_4b8 + 0x32) >> 8);
    pIVar60 = dst_tmp_array.Data + iVar58;
    pIVar72 = pIVar89->GlyphRanges;
    if (pIVar72 == (ImWchar *)0x0) {
      pIVar72 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar81[lVar61].SrcRanges = pIVar72;
    for (; *pIVar72 != 0; pIVar72 = pIVar72 + 2) {
      uVar69 = pIVar72[1];
      uVar84 = pIVar81[lVar61].GlyphsHighest;
      if (uVar69 == 0) goto LAB_001794c1;
      uVar98 = (uint)uVar69;
      if ((int)(uint)uVar69 < (int)uVar84) {
        uVar98 = uVar84;
      }
      pIVar81[lVar61].GlyphsHighest = uVar98;
    }
    uVar84 = pIVar81[lVar61].GlyphsHighest;
LAB_001794c1:
    pIVar60->SrcCount = pIVar60->SrcCount + 1;
    if ((int)uVar84 < pIVar60->GlyphsHighest) {
      uVar84 = pIVar60->GlyphsHighest;
    }
    pIVar60->GlyphsHighest = uVar84;
    lVar61 = local_360 + 1;
  }
  pIVar73 = (ImVector<unsigned_int> *)0x0;
  auVar121._12_4_ = 0;
  auVar121._0_12_ = auStack_4e4;
  _y0_2 = auVar121 << 0x20;
  while( true ) {
    uVar96 = (ulong)src_tmp_array.Size;
    if ((long)uVar96 <= (long)pIVar73) break;
    pIVar81 = src_tmp_array.Data;
    iVar57 = src_tmp_array.Data[(long)pIVar73].DstIndex;
    pIVar60 = dst_tmp_array.Data;
    local_498 = pIVar73;
    ImBitVector::Create(&src_tmp_array.Data[(long)pIVar73].GlyphsSet,
                        src_tmp_array.Data[(long)pIVar73].GlyphsHighest + 1);
    if (pIVar60[iVar57].GlyphsSet.Storage.Size == 0) {
      ImBitVector::Create(&pIVar60[iVar57].GlyphsSet,pIVar60[iVar57].GlyphsHighest + 1);
    }
    pIVar81 = pIVar81 + (long)pIVar73;
    puVar74 = pIVar81->SrcRanges;
    while ((uVar84 = (uint)*puVar74, *puVar74 != 0 && (uVar69 = puVar74[1], uVar69 != 0))) {
      for (; local_4b8 = puVar74, uVar84 <= uVar69; uVar84 = uVar84 + 1) {
        puVar97 = pIVar60[iVar57].GlyphsSet.Storage.Data;
        uVar98 = 1 << ((byte)uVar84 & 0x1f);
        if (((puVar97[uVar84 >> 5] >> (uVar84 & 0x1f) & 1) == 0) &&
           (iVar58 = stbtt_FindGlyphIndex(&pIVar81->FontInfo,uVar84), iVar58 != 0)) {
          pIVar81->GlyphsCount = pIVar81->GlyphsCount + 1;
          pIVar60[iVar57].GlyphsCount = pIVar60[iVar57].GlyphsCount + 1;
          uVar96 = (ulong)((uVar84 >> 5) << 2);
          puVar62 = (uint *)((long)(pIVar81->GlyphsSet).Storage.Data + uVar96);
          *puVar62 = *puVar62 | uVar98;
          puVar97 = (uint *)((long)puVar97 + uVar96);
          *puVar97 = *puVar97 | uVar98;
          y0_2 = (float)((int)y0_2 + 1);
        }
        puVar74 = local_4b8;
      }
      puVar74 = local_4b8 + 2;
    }
    pIVar73 = (ImVector<unsigned_int> *)((long)&local_498->Size + 1);
  }
  puVar74 = (ushort *)0x0;
  while (pIVar95 = local_4a8, (long)puVar74 < (long)(int)uVar96) {
    pIVar83 = src_tmp_array.Data;
    pIVar81 = src_tmp_array.Data + (long)puVar74;
    local_4b8 = puVar74;
    ImVector<int>::reserve(&pIVar81->GlyphsList,src_tmp_array.Data[(long)puVar74].GlyphsCount);
    local_498 = &pIVar83[(long)puVar74].GlyphsSet.Storage;
    puVar97 = pIVar83[(long)puVar74].GlyphsSet.Storage.Data;
    puVar62 = puVar97 + pIVar83[(long)puVar74].GlyphsSet.Storage.Size;
    iVar57 = 0;
    for (; puVar97 < puVar62; puVar97 = puVar97 + 1) {
      uVar84 = *puVar97;
      if (uVar84 != 0) {
        for (uVar98 = 0; uVar98 != 0x20; uVar98 = uVar98 + 1) {
          if ((uVar84 >> (uVar98 & 0x1f) & 1) != 0) {
            x0 = iVar57 + uVar98;
            ImVector<int>::push_back(&pIVar81->GlyphsList,&x0);
          }
        }
      }
      iVar57 = iVar57 + 0x20;
    }
    ImVector<unsigned_int>::clear(local_498);
    uVar96 = (ulong)(uint)src_tmp_array.Size;
    puVar74 = (ushort *)((long)local_4b8 + 1);
  }
  lVar61 = 0x10;
  for (lVar99 = 0; lVar99 < dst_tmp_array.Size; lVar99 = lVar99 + 1) {
    ImVector<unsigned_int>::clear
              ((ImVector<unsigned_int> *)((long)&(dst_tmp_array.Data)->SrcCount + lVar61));
    lVar61 = lVar61 + 0x20;
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects.Size = 0;
  buf_rects.Capacity = 0;
  buf_rects.Data = (stbrp_rect *)0x0;
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,(int)y0_2);
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,(int)y0_2);
  memset(buf_rects.Data,0,(long)buf_rects.Size * 0x18);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  iVar57 = 0;
  local_4b8 = (ushort *)((ulong)local_4b8 & 0xffffffff00000000);
  y0_2 = 0.0;
  pIVar73 = (ImVector<unsigned_int> *)0x0;
  while ((long)pIVar73 < (long)src_tmp_array.Size) {
    iVar58 = src_tmp_array.Data[(long)pIVar73].GlyphsCount;
    pIVar100 = pIVar73;
    if (iVar58 != 0) {
      pIVar81 = src_tmp_array.Data + (long)pIVar73;
      pIVar81->Rects = buf_rects.Data + (int)(float)local_4b8;
      pIVar81->PackedChars = buf_packedchars.Data + iVar57;
      pIVar89 = (pIVar95->ConfigData).Data;
      fVar106 = pIVar89[(long)pIVar73].SizePixels;
      fVar126 = pIVar89[(long)pIVar73].RasterizerDensity;
      (pIVar81->PackRange).font_size = fVar106 * fVar126;
      (pIVar81->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar81->PackRange).array_of_unicode_codepoints = (pIVar81->GlyphsList).Data;
      iVar59 = (pIVar81->GlyphsList).Size;
      (pIVar81->PackRange).num_chars = iVar59;
      (pIVar81->PackRange).chardata_for_range = buf_packedchars.Data + iVar57;
      (pIVar81->PackRange).h_oversample = (uchar)pIVar89[(long)pIVar73].OversampleH;
      (pIVar81->PackRange).v_oversample = (uchar)pIVar89[(long)pIVar73].OversampleV;
      local_498 = pIVar73;
      if (fVar106 <= 0.0) {
        uVar69 = *(ushort *)((pIVar81->FontInfo).data + (long)(pIVar81->FontInfo).head + 0x12);
        fVar126 = (fVar126 * -fVar106) / (float)(ushort)(uVar69 << 8 | uVar69 >> 8);
        fVar106 = fVar126;
      }
      else {
        fVar106 = stbtt_ScaleForPixelHeight(&pIVar81->FontInfo,fVar106 * fVar126);
      }
      local_4b8 = (ushort *)CONCAT44(local_4b8._4_4_,(int)(float)local_4b8 + iVar58);
      iVar57 = iVar57 + iVar58;
      iVar58 = local_4a8->TexGlyphPadding + -1;
      lVar61 = 2;
      for (lVar99 = 0; pIVar95 = local_4a8, pIVar100 = local_498, lVar99 < iVar59;
          lVar99 = lVar99 + 1) {
        iVar59 = stbtt_FindGlyphIndex(&pIVar81->FontInfo,(pIVar81->GlyphsList).Data[lVar99]);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar81->FontInfo,iVar59,(float)pIVar89[(long)pIVar73].OversampleH * fVar106,
                   (float)pIVar89[(long)pIVar73].OversampleV * fVar106,fVar106,fVar126,&x0,
                   (int *)&charstrings,(int *)&fdarrayoff,&y1);
        iVar59 = ((fdarrayoff + iVar58) - x0) + pIVar89[(long)pIVar73].OversampleH;
        psVar15 = pIVar81->Rects;
        *(int *)((long)psVar15 + lVar61 * 4 + -4) = iVar59;
        iVar80 = ((y1 + iVar58) - charstrings) + pIVar89[(long)pIVar73].OversampleV;
        (&psVar15->id)[lVar61] = iVar80;
        y0_2 = (float)((int)y0_2 + iVar80 * iVar59);
        iVar59 = (pIVar81->GlyphsList).Size;
        lVar61 = lVar61 + 6;
      }
    }
    pIVar73 = (ImVector<unsigned_int> *)((long)&pIVar100->Size + 1);
  }
  fVar106 = (float)(int)y0_2;
  if (fVar106 < 0.0) {
    fVar106 = sqrtf(fVar106);
  }
  else {
    fVar106 = SQRT(fVar106);
  }
  pIVar95->TexHeight = 0;
  local_4c0 = pIVar95->TexDesiredWidth;
  if (local_4c0 < 1) {
    iVar57 = (int)fVar106;
    local_4c0 = 0x1000;
    if ((iVar57 < 0xb33) && (local_4c0 = 0x800, iVar57 < 0x599)) {
      local_4c0 = (uint)(0x2cb < iVar57) * 0x200 + 0x200;
    }
  }
  pIVar95->TexWidth = local_4c0;
  iVar57 = pIVar95->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar58 = local_4c0 - iVar57;
  local_480 = (stbrp_node *)ImGui::MemAlloc((long)iVar58 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_480 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_480 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_480);
    }
    local_480 = (stbrp_node *)0x0;
    iVar57 = 0;
    local_4c0 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar84 = iVar58 - 1;
    uVar90 = 0;
    psVar102 = local_480;
    uVar96 = uVar90;
    if (0 < (int)uVar84) {
      uVar90 = (ulong)uVar84;
      uVar96 = uVar90;
    }
    while( true ) {
      bVar105 = uVar90 == 0;
      uVar90 = uVar90 - 1;
      if (bVar105) break;
      psVar102->next = psVar102 + 1;
      psVar102 = psVar102 + 1;
    }
    local_480[uVar96].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_480;
    ptr->active_head = ptr->extra;
    ptr->width = iVar58;
    ptr->height = 0x8000 - iVar57;
    ptr->num_nodes = iVar58;
    ptr->align = (int)(uVar84 + iVar58) / iVar58;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = iVar58;
    ptr->extra[1].y = 0x40000000;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_368 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar95,ptr);
  for (lVar61 = 0; lVar61 < src_tmp_array.Size; lVar61 = lVar61 + 1) {
    pIVar81 = src_tmp_array.Data;
    if (src_tmp_array.Data[lVar61].GlyphsCount != 0) {
      stbrp_pack_rects(local_368,src_tmp_array.Data[lVar61].Rects,
                       src_tmp_array.Data[lVar61].GlyphsCount);
      uVar84 = pIVar81[lVar61].GlyphsCount;
      if ((int)uVar84 < 1) {
        uVar84 = 0;
      }
      for (lVar99 = 0; (ulong)uVar84 * 0x18 - lVar99 != 0; lVar99 = lVar99 + 0x18) {
        psVar15 = pIVar81[lVar61].Rects;
        if (*(int *)((long)&psVar15->was_packed + lVar99) != 0) {
          iVar58 = *(int *)((long)&psVar15->h + lVar99) + *(int *)((long)&psVar15->y + lVar99);
          if (iVar58 < pIVar95->TexHeight) {
            iVar58 = pIVar95->TexHeight;
          }
          pIVar95->TexHeight = iVar58;
        }
      }
    }
  }
  uVar84 = pIVar95->TexHeight;
  if ((pIVar95->Flags & 1) == 0) {
    uVar84 = (int)(uVar84 - 1) >> 1 | uVar84 - 1;
    uVar84 = (int)uVar84 >> 2 | uVar84;
    uVar84 = (int)uVar84 >> 4 | uVar84;
    uVar84 = (int)uVar84 >> 8 | uVar84;
    uVar84 = (int)uVar84 >> 0x10 | uVar84;
  }
  iVar58 = uVar84 + 1;
  pIVar95->TexHeight = iVar58;
  auVar108._0_4_ = (float)pIVar95->TexWidth;
  auVar108._4_4_ = (float)iVar58;
  auVar108._8_8_ = 0;
  auVar121 = divps(_DAT_001b8390,auVar108);
  pIVar95->TexUvScale = auVar121._0_8_;
  puVar63 = (uchar *)ImGui::MemAlloc((long)(iVar58 * pIVar95->TexWidth));
  pIVar95->TexPixelsAlpha8 = puVar63;
  memset(puVar63,0,(long)pIVar95->TexHeight * (long)pIVar95->TexWidth);
  puVar63 = pIVar95->TexPixelsAlpha8;
  lVar61 = (long)local_4c0;
  local_308 = puVar63 + 1;
  lVar99 = 0;
  psVar102 = local_480;
  local_288 = iVar57;
  iStack_284 = iVar57;
  iStack_280 = iVar57;
  iStack_27c = iVar57;
  while (lVar99 < src_tmp_array.Size) {
    local_358 = lVar99;
    if (src_tmp_array.Data[lVar99].GlyphsCount != 0) {
      local_318 = (local_4a8->ConfigData).Data;
      pIVar81 = src_tmp_array.Data + lVar99;
      psVar15 = pIVar81->Rects;
      bVar105 = true;
      uVar96 = 0xffffffffffffffff;
      lVar99 = 0;
      local_348 = pIVar81;
      while( true ) {
        uVar119 = 0x80000000;
        uVar118 = 0x80000000;
        uVar115 = 0x80000000;
        if (!bVar105) break;
        fVar106 = (pIVar81->PackRange).font_size;
        if (fVar106 <= 0.0) {
          uVar69 = *(ushort *)((pIVar81->FontInfo).data + (long)(pIVar81->FontInfo).head + 0x12);
          local_2b8 = -fVar106 / (float)(ushort)(uVar69 << 8 | uVar69 >> 8);
        }
        else {
          local_2b8 = stbtt_ScaleForPixelHeight(&pIVar81->FontInfo,fVar106);
          uVar96 = uVar96 & 0xffffffff;
          uVar115 = extraout_var._0_4_;
          uVar118 = extraout_var._4_4_;
          uVar119 = extraout_var._8_4_;
        }
        uVar90._0_1_ = (pIVar81->PackRange).h_oversample;
        uVar19 = (pIVar81->PackRange).v_oversample;
        uVar20 = *(undefined6 *)&(pIVar81->PackRange).field_0x22;
        uVar90._1_7_ = CONCAT61(uVar20,uVar19);
        auVar25._8_6_ = 0;
        auVar25._0_8_ = uVar90;
        auVar25[0xe] = (char)((uint6)uVar20 >> 0x28);
        auVar27._8_4_ = 0;
        auVar27._0_8_ = uVar90;
        auVar27[0xc] = (char)((uint6)uVar20 >> 0x20);
        auVar27._13_2_ = auVar25._13_2_;
        auVar28._8_4_ = 0;
        auVar28._0_8_ = uVar90;
        auVar28._12_3_ = auVar27._12_3_;
        auVar29._8_2_ = 0;
        auVar29._0_8_ = uVar90;
        auVar29[10] = (char)((uint6)uVar20 >> 0x18);
        auVar29._11_4_ = auVar28._11_4_;
        auVar30._8_2_ = 0;
        auVar30._0_8_ = uVar90;
        auVar30._10_5_ = auVar29._10_5_;
        auVar31[8] = (char)((uint6)uVar20 >> 0x10);
        auVar31._0_8_ = uVar90;
        auVar31._9_6_ = auVar30._9_6_;
        auVar36._7_8_ = 0;
        auVar36._0_7_ = auVar31._8_7_;
        cVar114 = (char)((uint6)uVar20 >> 8);
        Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),cVar114);
        auVar43._9_6_ = 0;
        auVar43._0_9_ = Var37;
        cVar112 = (char)uVar20;
        auVar32[4] = cVar112;
        auVar32._0_4_ = (uint)uVar90;
        auVar32._5_10_ = SUB1510(auVar43 << 0x30,5);
        auVar38._11_4_ = 0;
        auVar38._0_11_ = auVar32._4_11_;
        auVar39._1_12_ = SUB1512(auVar38 << 0x20,3);
        auVar39[0] = uVar19;
        uVar69 = CONCAT11(0,(undefined1)uVar90);
        auVar33._2_13_ = auVar39;
        auVar33._0_2_ = uVar69;
        uVar113 = auVar39._0_2_;
        sVar23 = -auVar32._4_2_;
        sVar117 = (short)Var37;
        sVar24 = -sVar117;
        auVar26._10_2_ = 0;
        auVar26._0_10_ = auVar33._0_10_;
        auVar26._12_2_ = sVar117;
        uVar44 = CONCAT42(auVar26._10_4_,auVar32._4_2_);
        auVar40._6_8_ = 0;
        auVar40._0_6_ = uVar44;
        Var41 = CONCAT82(SUB148(auVar40 << 0x40,6),uVar113);
        local_258._0_4_ = CONCAT22(0,uVar69);
        local_258._4_10_ = Var41;
        local_258._14_2_ = 0;
        auVar109._0_4_ = (float)local_258._0_4_;
        auVar109._4_4_ = (float)(int)Var41;
        auVar109._8_4_ = (float)(int)uVar44;
        auVar109._12_4_ = (float)(auVar26._10_4_ >> 0x10);
        local_278 = divps(_DAT_001b8390,auVar109);
        auVar130[0] = -((undefined1)uVar90 == 0);
        auVar130[1] = -((undefined1)uVar90 == 0);
        auVar130[2] = -((undefined1)uVar90 == 0);
        auVar130[3] = -((undefined1)uVar90 == 0);
        auVar130[4] = -(uVar19 == '\0');
        auVar130[5] = -(uVar19 == '\0');
        auVar130[6] = -(uVar19 == '\0');
        auVar130[7] = -(uVar19 == '\0');
        auVar130[8] = -(cVar112 == '\0');
        auVar130[9] = -(cVar112 == '\0');
        auVar130[10] = -(cVar112 == '\0');
        auVar130[0xb] = -(cVar112 == '\0');
        auVar130[0xc] = -(cVar114 == '\0');
        auVar130[0xd] = -(cVar114 == '\0');
        auVar130[0xe] = -(cVar114 == '\0');
        auVar130[0xf] = -(cVar114 == '\0');
        Var41 = CONCAT64(CONCAT42(CONCAT22(sVar24,sVar24),sVar23),CONCAT22(sVar23,sVar24));
        auVar42._4_8_ = (long)((unkuint10)Var41 >> 0x10);
        auVar42._2_2_ = 1 - uVar113;
        auVar42._0_2_ = 1 - uVar113;
        auVar122._0_4_ = (float)(int)(short)(1 - uVar69);
        auVar122._4_4_ = (float)(auVar42._0_4_ >> 0x10);
        auVar122._8_4_ = (float)((int)((unkuint10)Var41 >> 0x10) >> 0x10);
        auVar122._12_4_ = (float)(int)sVar24;
        local_298 = local_2b8 * auVar109._0_4_;
        local_2a8 = local_2b8 * auVar109._4_4_;
        fStack_290 = local_2b8 * auVar109._8_4_;
        fStack_28c = local_2b8 * auVar109._12_4_;
        auVar110._0_4_ = auVar109._0_4_ + auVar109._0_4_;
        auVar110._4_4_ = auVar109._4_4_ + auVar109._4_4_;
        auVar110._8_4_ = auVar109._8_4_ + auVar109._8_4_;
        auVar110._12_4_ = auVar109._12_4_ + auVar109._12_4_;
        local_268 = divps(auVar122,auVar110);
        local_268 = ~auVar130 & local_268;
        lVar99 = (long)(int)lVar99;
        fVar106 = local_2a8;
        if (local_298 <= local_2a8) {
          fVar106 = local_298;
        }
        fVar106 = (0.35 / fVar106) * (0.35 / fVar106);
        fStack_244 = -local_2a8;
        local_330 = uVar90 & 0xff;
        local_338 = (ulong)((uint)uVar90._1_7_ & 0xff);
        uVar84 = (uint)uVar90 & 0xff;
        uVar90 = 0;
        uStack_2b4 = uVar115;
        uStack_2b0 = uVar118;
        uStack_2ac = uVar119;
        fStack_2a4 = local_2a8;
        fStack_2a0 = local_2a8;
        fStack_29c = local_2a8;
        fStack_294 = local_2a8;
        local_248 = local_298;
        fStack_240 = local_298;
        fStack_23c = fStack_244;
LAB_00179e19:
        fVar126 = -0.0;
        if ((long)uVar90 < (long)(pIVar81->PackRange).num_chars) {
          if (psVar15[lVar99].was_packed != 0) {
            uVar13 = psVar15[lVar99].w;
            uVar21 = psVar15[lVar99].h;
            if (uVar13 == 0) {
              if ((uVar21 == 0) && (-1 < (int)uVar96)) {
                psVar16 = (pIVar81->PackRange).chardata_for_range;
                psVar18 = psVar16 + (uVar96 & 0xffffffff);
                uVar46 = psVar18->x0;
                uVar47 = psVar18->y0;
                uVar48 = psVar18->x1;
                uVar49 = psVar18->y1;
                fVar132 = psVar18->xoff;
                fVar125 = psVar18->yoff;
                psVar18 = psVar16 + (uVar96 & 0xffffffff);
                fVar126 = psVar18->xadvance;
                fVar123 = psVar18->xoff2;
                fVar107 = psVar18->yoff2;
                psVar45 = psVar16 + uVar90;
                psVar45->yoff = psVar18->yoff;
                psVar45->xadvance = fVar126;
                psVar45->xoff2 = fVar123;
                psVar45->yoff2 = fVar107;
                psVar16 = psVar16 + uVar90;
                psVar16->x0 = uVar46;
                psVar16->y0 = uVar47;
                psVar16->x1 = uVar48;
                psVar16->y1 = uVar49;
                psVar16->xoff = fVar132;
                psVar16->yoff = fVar125;
              }
              goto LAB_0017b4ab;
            }
            if (uVar21 == 0) goto LAB_0017b4ab;
            piVar82 = (pIVar81->PackRange).array_of_unicode_codepoints;
            if (piVar82 == (int *)0x0) {
              iVar57 = (pIVar81->PackRange).first_unicode_codepoint_in_range + (int)uVar90;
            }
            else {
              iVar57 = piVar82[uVar90];
            }
            local_2e0 = (pIVar81->PackRange).chardata_for_range + uVar90;
            uVar98 = stbtt_FindGlyphIndex(&pIVar81->FontInfo,iVar57);
            uVar1 = psVar15[lVar99].x;
            uVar6 = psVar15[lVar99].y;
            fVar123 = (float)(uVar13 - local_288);
            psVar15[lVar99].w = (stbrp_coord)fVar123;
            psVar15[lVar99].h = uVar21 - iStack_284;
            psVar15[lVar99].x = uVar1 + iStack_280;
            psVar15[lVar99].y = uVar6 + iStack_27c;
            puVar104 = (pIVar81->FontInfo).data;
            uVar69 = *(ushort *)(puVar104 + (long)(pIVar81->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar104 + (long)(pIVar81->FontInfo).hhea + 0x22) >> 8;
            iVar57 = (pIVar81->FontInfo).hmtx;
            lVar71 = (ulong)uVar69 * 4 + (long)iVar57 + -4;
            lVar78 = (ulong)uVar69 * 4 + (long)iVar57 + -3;
            if ((int)uVar98 < (int)(uint)uVar69) {
              lVar71 = (long)(int)(uVar98 * 4) + (long)iVar57;
              lVar78 = (long)(int)(uVar98 * 4) + 1 + (long)iVar57;
            }
            uVar9 = puVar104[lVar71];
            uVar10 = puVar104[lVar78];
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar81->FontInfo,uVar98,local_298,local_2a8,fVar123,fVar126,&x0_1,&y0_1,
                       &x1_1,&local_2c0);
            iVar57 = psVar15[lVar99].x;
            iVar58 = psVar15[lVar99].y;
            local_4b8._0_4_ = (float)psVar15[lVar99].w;
            local_4b8._4_4_ = psVar15[lVar99].h;
            uStack_4b0 = 0;
            local_340 = (ulong)uVar98;
            uVar98 = stbtt_GetGlyphShape(&pIVar81->FontInfo,uVar98,(stbtt_vertex **)&fdarrayoff);
            iVar59 = (int)(float)local_4b8 - local_258._0_4_;
            local_4b8._4_4_ = local_4b8._4_4_ - local_258._4_4_;
            uStack_4b0._0_4_ = (int)uStack_4b0 - local_258._8_4_;
            uStack_4b0._4_4_ = uStack_4b0._4_4_ - local_258._12_4_;
            local_4b8 = (ushort *)CONCAT44(local_4b8._4_4_,iVar59);
            fStack_490 = (float)((int)uStack_4b0 + 1);
            fStack_48c = (float)(uStack_4b0._4_4_ + 1);
            local_498 = (ImVector<unsigned_int> *)CONCAT44(local_4b8._4_4_ + 1,iVar59 + 1);
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&local_348->FontInfo,(int)local_340,local_298,local_2a8,fVar123,fVar126,&y1,
                       &iy0,(int *)0x0,(int *)0x0);
            iVar59 = y1;
            auVar111._0_4_ = -(uint)((float)local_498 == 0.0);
            auVar111._4_4_ = -(uint)((float)local_498 == 0.0);
            auVar111._8_4_ = -(uint)(local_498._4_4_ == 0.0);
            auVar111._12_4_ = -(uint)(local_498._4_4_ == 0.0);
            iVar80 = movmskpd(extraout_EAX,auVar111);
            if (iVar80 == 0) {
              local_2c8 = puVar63 + iVar58 * lVar61 + (long)iVar57;
              lVar71 = CONCAT44(uStack_454,fdarrayoff);
              local_350 = (ulong)(uint)iy0;
              uVar64 = 0;
              uVar76 = (ulong)uVar98;
              if ((int)uVar98 < 1) {
                uVar76 = uVar64;
              }
              uVar75 = 0;
              for (; uVar76 * 0xe - uVar64 != 0; uVar64 = uVar64 + 0xe) {
                uVar75 = (ulong)((int)uVar75 + (uint)(*(char *)(lVar71 + 0xc + uVar64) == '\x01'));
              }
              if (((int)uVar75 != 0) &&
                 (ptr_00 = ImGui::MemAlloc(uVar75 * 4), ptr_00 != (void *)0x0)) {
                local_460 = (stbtt__point *)0x0;
                iVar57 = 0;
                iVar80 = 0;
                iVar58 = 0;
                do {
                  if (iVar80 == 1) {
                    local_460 = (stbtt__point *)ImGui::MemAlloc((long)iVar58 << 3);
                    if (local_460 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      ImGui::MemFree(ptr_00);
                      break;
                    }
                  }
                  else if (iVar80 == 2) goto LAB_0017a319;
                  x0 = 0;
                  fVar126 = 0.0;
                  fVar123 = 0.0;
                  uVar98 = 0xffffffff;
                  for (lVar78 = 0; uVar76 * 0xe - lVar78 != 0; lVar78 = lVar78 + 0xe) {
                    iVar58 = x0;
                    switch(*(undefined1 *)(lVar71 + 0xc + lVar78)) {
                    case 1:
                      if (-1 < (int)uVar98) {
                        *(int *)((long)ptr_00 + (ulong)uVar98 * 4) = x0 - iVar57;
                      }
                      uVar98 = uVar98 + 1;
                      auVar121 = pshuflw(ZEXT416(*(uint *)(lVar71 + lVar78)),
                                         ZEXT416(*(uint *)(lVar71 + lVar78)),0x60);
                      fVar126 = (float)(auVar121._0_4_ >> 0x10);
                      fVar123 = (float)(auVar121._4_4_ >> 0x10);
                      iVar57 = x0;
                      iVar58 = x0 + 1;
                      if (local_460 != (stbtt__point *)0x0) {
                        local_460[x0].x = fVar126;
                        local_460[x0].y = fVar123;
                      }
                      break;
                    case 2:
                      auVar121 = pshuflw(ZEXT416(*(uint *)(lVar71 + lVar78)),
                                         ZEXT416(*(uint *)(lVar71 + lVar78)),0x60);
                      fVar126 = (float)(auVar121._0_4_ >> 0x10);
                      fVar123 = (float)(auVar121._4_4_ >> 0x10);
                      iVar58 = x0 + 1;
                      if (local_460 != (stbtt__point *)0x0) {
                        local_460[x0].x = fVar126;
                        local_460[x0].y = fVar123;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (local_460,&x0,fVar126,fVar123,
                                 (float)(int)*(short *)(lVar71 + 4 + lVar78),
                                 (float)(int)*(short *)(lVar71 + 6 + lVar78),
                                 (float)(int)*(short *)(lVar71 + lVar78),
                                 (float)(int)*(short *)(lVar71 + 2 + lVar78),fVar106,0);
                      goto LAB_0017a29a;
                    case 4:
                      stbtt__tesselate_cubic
                                (local_460,&x0,fVar126,fVar123,
                                 (float)(int)*(short *)(lVar71 + 4 + lVar78),
                                 (float)(int)*(short *)(lVar71 + 6 + lVar78),
                                 (float)(int)*(short *)(lVar71 + 8 + lVar78),
                                 (float)(int)*(short *)(lVar71 + 10 + lVar78),
                                 (float)(int)*(short *)(lVar71 + lVar78),
                                 (float)(int)*(short *)(lVar71 + 2 + lVar78),fVar106,0);
LAB_0017a29a:
                      auVar121 = pshuflw(ZEXT416(*(uint *)(lVar71 + lVar78)),
                                         ZEXT416(*(uint *)(lVar71 + lVar78)),0x60);
                      fVar126 = (float)(auVar121._0_4_ >> 0x10);
                      fVar123 = (float)(auVar121._4_4_ >> 0x10);
                      iVar58 = x0;
                    }
                    x0 = iVar58;
                  }
                  *(int *)((long)ptr_00 + (long)(int)uVar98 * 4) = x0 - iVar57;
                  iVar80 = iVar80 + 1;
                  iVar58 = x0;
                } while( true );
              }
            }
            goto LAB_0017aeb1;
          }
          goto LAB_0017b4ab;
        }
        bVar105 = false;
      }
      fVar106 = local_318[local_358].RasterizerMultiply;
      if ((fVar106 != 1.0) || (NAN(fVar106))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&x0,fVar106);
        piVar82 = &pIVar81->Rects->was_packed;
        for (iVar57 = 0; iVar57 < pIVar81->GlyphsCount; iVar57 = iVar57 + 1) {
          if (*piVar82 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&x0,local_4a8->TexPixelsAlpha8,piVar82[-2],piVar82[-1],piVar82[-4],
                       piVar82[-3],local_4a8->TexWidth);
          }
          piVar82 = piVar82 + 6;
        }
      }
      pIVar81->Rects = (stbrp_rect *)0x0;
    }
    lVar99 = local_358 + 1;
  }
  ImGui::MemFree(psVar102);
  pIVar95 = local_4a8;
  ImGui::MemFree(local_368);
  ImVector<stbrp_rect>::clear(&buf_rects);
  pIVar73 = (ImVector<unsigned_int> *)0x0;
  while ((long)pIVar73 < (long)src_tmp_array.Size) {
    pIVar81 = src_tmp_array.Data;
    pIVar83 = src_tmp_array.Data + (long)pIVar73;
    pIVar17 = (pIVar95->ConfigData).Data;
    pIVar89 = pIVar17 + (long)pIVar73;
    font = pIVar17[(long)pIVar73].DstFont;
    local_498 = pIVar73;
    fVar106 = stbtt_ScaleForPixelHeight(&pIVar83->FontInfo,pIVar17[(long)pIVar73].SizePixels);
    puVar63 = pIVar81[(long)pIVar73].FontInfo.data;
    lVar61 = (long)pIVar81[(long)pIVar73].FontInfo.hhea;
    uVar69 = *(ushort *)(puVar63 + lVar61 + 4);
    uVar113 = *(ushort *)(puVar63 + lVar61 + 6);
    fVar126 = ceilf((float)(int)(short)(uVar69 << 8 | uVar69 >> 8) * fVar106);
    fVar106 = ImFloor((float)(int)(short)(uVar113 << 8 | uVar113 >> 8) * fVar106);
    ImFontAtlasBuildSetupFont(pIVar95,font,pIVar89,fVar126,fVar106);
    fVar106 = (pIVar89->GlyphOffset).x;
    fVar126 = (float)(int)(font->Ascent + 0.5) + (pIVar89->GlyphOffset).y;
    local_4b8 = (ushort *)CONCAT44(local_4b8._4_4_,1.0 / pIVar89->RasterizerDensity);
    lVar99 = 0;
    for (lVar61 = 0; lVar61 < pIVar83->GlyphsCount; lVar61 = lVar61 + 1) {
      psVar18 = pIVar83->PackedChars;
      fVar107 = 1.0 / (float)local_4a8->TexHeight;
      fVar123 = 1.0 / (float)local_4a8->TexWidth;
      ImFont::AddGlyph(font,pIVar89,*(ImWchar *)((pIVar83->GlyphsList).Data + lVar61),
                       (*(float *)((long)&psVar18->xoff + lVar99) + 0.0) * (float)local_4b8 +
                       fVar106,(*(float *)((long)&psVar18->yoff + lVar99) + 0.0) * (float)local_4b8
                               + fVar126,
                       (*(float *)((long)&psVar18->xoff2 + lVar99) + 0.0) * (float)local_4b8 +
                       fVar106,(*(float *)((long)&psVar18->yoff2 + lVar99) + 0.0) * (float)local_4b8
                               + fVar126,(float)*(ushort *)((long)&psVar18->x0 + lVar99) * fVar123,
                       (float)*(ushort *)((long)&psVar18->y0 + lVar99) * fVar107,
                       (float)*(ushort *)((long)&psVar18->x1 + lVar99) * fVar123,
                       (float)*(ushort *)((long)&psVar18->y1 + lVar99) * fVar107,
                       *(float *)((long)&psVar18->xadvance + lVar99) * (float)local_4b8);
      lVar99 = lVar99 + 0x1c;
    }
    pIVar95 = local_4a8;
    pIVar73 = (ImVector<unsigned_int> *)((long)&local_498->Size + 1);
  }
  ImVector<ImFontBuildSrcData>::clear_destruct(&src_tmp_array);
  ImFontAtlasBuildFinish(pIVar95);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_0017b7de:
  bVar105 = local_310 <= local_360;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar105;
LAB_0017a319:
  if (local_460 != (stbtt__point *)0x0) {
    iVar57 = 0;
    for (uVar76 = 0; uVar75 != uVar76; uVar76 = uVar76 + 1) {
      iVar57 = iVar57 + *(int *)((long)ptr_00 + uVar76 * 4);
    }
    p = (stbtt__edge *)ImGui::MemAlloc((long)(iVar57 + 1) * 0x14);
    if (p != (stbtt__edge *)0x0) {
      iVar57 = 0;
      iVar58 = 0;
      for (uVar76 = 0; uVar76 != uVar75; uVar76 = uVar76 + 1) {
        iVar80 = *(int *)((long)ptr_00 + uVar76 * 4);
        uVar93 = (ulong)(iVar80 - 1);
        iVar70 = iVar80;
        for (uVar64 = 0; iVar116 = (int)uVar93, (long)uVar64 < (long)iVar70; uVar64 = uVar64 + 1) {
          fVar126 = local_460[(long)iVar57 + (long)iVar116].y;
          fVar123 = local_460[(long)iVar57 + uVar64].y;
          if ((fVar126 != fVar123) || (NAN(fVar126) || NAN(fVar123))) {
            iVar92 = (int)uVar64;
            iVar70 = iVar116;
            if (fVar126 <= fVar123) {
              iVar70 = iVar92;
              iVar92 = iVar116;
            }
            p[iVar58].invert = (uint)(fVar123 < fVar126);
            sVar3 = local_460[(long)iVar57 + (long)iVar70];
            sVar4 = local_460[(long)iVar57 + (long)iVar92];
            psVar65 = p + iVar58;
            psVar65->x0 = sVar3.x * local_248 + 0.0;
            psVar65->y0 = sVar3.y * fStack_244 + 0.0;
            psVar65->x1 = sVar4.x * fStack_240 + 0.0;
            psVar65->y1 = sVar4.y * fStack_23c + 0.0;
            iVar58 = iVar58 + 1;
            iVar70 = *(int *)((long)ptr_00 + uVar76 * 4);
          }
          uVar93 = uVar64 & 0xffffffff;
        }
        iVar57 = iVar80 + iVar57;
      }
      stbtt__sort_edges_quicksort(p,iVar58);
      psVar65 = p;
      for (uVar76 = 1; (long)uVar76 < (long)iVar58; uVar76 = uVar76 + 1) {
        uVar2 = p[uVar76].x0;
        uVar7 = p[uVar76].y0;
        uStack_230 = p[uVar76].invert;
        uVar14 = p[uVar76].x1;
        uVar22 = p[uVar76].y1;
        psVar86 = psVar65;
        for (uVar64 = uVar76; 0 < (long)uVar64; uVar64 = uVar64 - 1) {
          if (psVar86->y0 <= (float)uVar7) goto LAB_0017a4dd;
          psVar86[1].invert = psVar86->invert;
          fVar126 = psVar86->y0;
          fVar123 = psVar86->x1;
          fVar107 = psVar86->y1;
          psVar86[1].x0 = psVar86->x0;
          psVar86[1].y0 = fVar126;
          psVar86[1].x1 = fVar123;
          psVar86[1].y1 = fVar107;
          psVar86 = psVar86 + -1;
        }
        uVar64 = 0;
LAB_0017a4dd:
        iVar57 = (int)uVar64;
        if (uVar76 != (uVar64 & 0xffffffff)) {
          p[iVar57].x0 = (float)uVar2;
          p[iVar57].y0 = (float)uVar7;
          p[iVar57].x1 = (float)uVar14;
          p[iVar57].y1 = (float)uVar22;
          p[iVar57].invert = uStack_230;
        }
        psVar65 = psVar65 + 1;
        x0 = uVar14;
        uStack_234 = uVar22;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      fVar126 = (float)local_498;
      scanline_00 = (float *)&x0;
      if (0x40 < (int)(float)local_498) {
        scanline_00 = (float *)ImGui::MemAlloc(((ulong)local_498 & 0xffffffff) * 8 + 4);
      }
      local_2d0 = (long)(int)fVar126;
      scanline = scanline_00 + local_2d0;
      p[iVar58].y0 = (float)((int)local_350 + (int)local_498._4_4_) + 1.0;
      local_2f0 = local_2d0 * 4;
      local_2f8 = (long)((int)(float)local_4b8 + 2) << 2;
      local_44c = (float)(int)fVar126;
      if ((int)fVar126 < 1) {
        fVar126 = 0.0;
      }
      local_300 = 0;
      if (0 < local_2d0) {
        local_300 = local_2d0;
      }
      iVar57 = 0;
      local_2e8 = (ulong)(uint)local_498._4_4_;
      if ((int)local_498._4_4_ < 1) {
        local_2e8 = 0;
      }
      psVar67 = (stbtt__active_edge *)0x0;
      local_450 = 0;
      local_3c8 = (undefined8 *)0x0;
      uVar76 = local_350 & 0xffffffff;
      psVar65 = p;
      for (iVar58 = 0; iVar58 != (int)local_2e8; iVar58 = iVar58 + 1) {
        fVar123 = (float)(int)uVar76;
        memset(scanline_00,0,local_2f0);
        memset(scanline,0,local_2f8);
        psVar94 = (stbtt__active_edge *)&charstrings;
        while (psVar77 = psVar94, psVar103 = psVar77->next, psVar103 != (stbtt__active_edge *)0x0) {
          psVar94 = psVar103;
          if (psVar103->ey <= fVar123) {
            psVar77->next = psVar103->next;
            psVar103->direction = 0.0;
            psVar103->next = psVar67;
            psVar94 = psVar77;
            psVar67 = psVar103;
          }
        }
        bVar105 = (int)local_350 != 0;
        fVar107 = fVar123 + 1.0;
        for (; fVar132 = psVar65->y0, fVar132 <= fVar107; psVar65 = psVar65 + 1) {
          fVar125 = psVar65->y1;
          if ((fVar132 != fVar125) || (NAN(fVar132) || NAN(fVar125))) {
            if (psVar67 == (stbtt__active_edge *)0x0) {
              if (local_450 == 0) {
                puVar66 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar66 == (undefined8 *)0x0) {
                  psVar67 = (stbtt__active_edge *)0x0;
                  local_450 = 0;
                  goto LAB_0017a832;
                }
                *puVar66 = local_3c8;
                fVar132 = psVar65->y0;
                fVar125 = psVar65->y1;
                local_450 = 799;
                local_3c8 = puVar66;
              }
              else {
                local_450 = local_450 + -1;
              }
              psVar103 = (stbtt__active_edge *)(local_3c8 + (long)local_450 * 4 + 1);
              psVar94 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar94 = psVar67->next;
              psVar103 = psVar67;
            }
            psVar67 = psVar94;
            fVar120 = psVar65->x0;
            fVar127 = (psVar65->x1 - fVar120) / (fVar125 - fVar132);
            psVar103->fdx = fVar127;
            psVar103->fdy = (float)(-(uint)(fVar127 != 0.0) & (uint)(1.0 / fVar127));
            psVar103->fx = ((fVar123 - fVar132) * fVar127 + fVar120) - (float)iVar59;
            psVar103->direction = *(float *)(&DAT_001c5d30 + (ulong)(psVar65->invert == 0) * 4);
            psVar103->sy = fVar132;
            psVar103->ey = fVar125;
            psVar103->next = (stbtt__active_edge *)0x0;
            if (fVar125 < fVar123 && (iVar58 == 0 && bVar105)) {
              psVar103->ey = fVar123;
            }
            psVar103->next = _charstrings;
            _charstrings = psVar103;
          }
LAB_0017a832:
        }
        if (_charstrings != (stbtt__active_edge *)0x0) {
          local_2d8 = psVar65;
          for (psVar94 = _charstrings; psVar65 = local_2d8, psVar94 != (stbtt__active_edge *)0x0;
              psVar94 = psVar94->next) {
            fVar132 = psVar94->fx;
            fVar125 = psVar94->fdx;
            if ((fVar125 != 0.0) || (NAN(fVar125))) {
              fVar133 = fVar125 + fVar132;
              fVar120 = psVar94->sy;
              fVar127 = (float)(~-(uint)(fVar123 < fVar120) & (uint)fVar132 |
                               (uint)((fVar120 - fVar123) * fVar125 + fVar132) &
                               -(uint)(fVar123 < fVar120));
              if (0.0 <= fVar127) {
                fVar124 = psVar94->ey;
                fVar129 = (float)(-(uint)(fVar124 < fVar107) &
                                  (uint)((fVar124 - fVar123) * fVar125 + fVar132) |
                                 ~-(uint)(fVar124 < fVar107) & (uint)fVar133);
                if (((0.0 <= fVar129) && (fVar127 < local_44c)) && (fVar129 < local_44c)) {
                  if (fVar120 <= fVar123) {
                    fVar120 = fVar123;
                  }
                  iVar80 = (int)fVar127;
                  if (fVar107 <= fVar124) {
                    fVar124 = fVar107;
                  }
                  iVar70 = (int)fVar129;
                  if (iVar80 == iVar70) {
                    fVar134 = (fVar124 - fVar120) * psVar94->direction;
                    lVar71 = (long)iVar80;
                    scanline_00[lVar71] =
                         ((((float)iVar80 + 1.0) - fVar129) + (((float)iVar80 + 1.0) - fVar127)) *
                         0.5 * fVar134 + scanline_00[lVar71];
                  }
                  else {
                    fVar125 = psVar94->fdy;
                    iVar116 = iVar80;
                    fVar128 = fVar129;
                    if (fVar129 < fVar127) {
                      fVar128 = fVar123 - fVar120;
                      fVar120 = (fVar123 - fVar124) + fVar107;
                      fVar125 = -fVar125;
                      fVar132 = fVar133;
                      fVar124 = fVar128 + fVar107;
                      iVar116 = iVar70;
                      iVar70 = iVar80;
                      fVar128 = fVar127;
                      fVar127 = fVar129;
                    }
                    iVar80 = iVar116 + 1;
                    fVar131 = (float)iVar70;
                    fVar129 = ((float)iVar80 - fVar132) * fVar125 + fVar123;
                    fVar133 = fVar107;
                    if (fVar129 <= fVar107) {
                      fVar133 = fVar129;
                    }
                    fVar134 = psVar94->direction;
                    fVar129 = (fVar133 - fVar120) * fVar134;
                    fVar132 = (fVar131 - fVar132) * fVar125 + fVar123;
                    scanline_00[iVar116] =
                         ((float)iVar80 - fVar127) * fVar129 * 0.5 + scanline_00[iVar116];
                    if ((fVar107 < fVar132) && (fVar132 = fVar107, iVar70 - iVar80 != 0)) {
                      fVar125 = (fVar107 - fVar133) / (float)(iVar70 - iVar80);
                    }
                    lVar71 = (long)iVar70;
                    for (lVar78 = (long)iVar80; lVar78 < lVar71; lVar78 = lVar78 + 1) {
                      scanline_00[lVar78] = fVar125 * fVar134 * 0.5 + fVar129 + scanline_00[lVar78];
                      fVar129 = fVar129 + fVar125 * fVar134;
                    }
                    scanline_00[lVar71] =
                         (((fVar131 + 1.0) - fVar128) + ((fVar131 + 1.0) - fVar131)) * 0.5 *
                         (fVar124 - fVar132) * fVar134 + fVar129 + scanline_00[lVar71];
                    fVar134 = (fVar124 - fVar120) * fVar134;
                  }
                  scanline[lVar71 + 1] = fVar134 + scanline[lVar71 + 1];
                  goto LAB_0017ad85;
                }
              }
              local_328 = fVar132;
              uStack_324 = 0;
              uStack_320 = 0;
              uStack_31c = 0;
              fVar132 = 0.0;
              while (fVar126 != fVar132) {
                fVar120 = (float)(int)fVar132;
                fVar124 = (float)((int)fVar132 + 1);
                fVar127 = (fVar120 - local_328) / fVar125 + fVar123;
                fVar129 = (fVar124 - local_328) / fVar125 + fVar123;
                local_4b8 = (ushort *)CONCAT44(local_4b8._4_4_,fVar127);
                local_498 = (ImVector<unsigned_int> *)CONCAT44(local_498._4_4_,fVar120);
                if ((fVar120 <= local_328) || (fVar133 <= fVar124)) {
                  if ((fVar120 <= fVar133) || (local_328 <= fVar124)) {
                    fVar128 = fVar123;
                    fVar131 = local_328;
                    if (((fVar120 <= local_328) || (fVar133 <= fVar120)) &&
                       ((fVar120 <= fVar133 || (local_328 <= fVar120)))) {
                      fVar120 = fVar123;
                      fVar127 = local_328;
                      if (((local_328 < fVar124) && (fVar124 < fVar133)) ||
                         ((fVar133 < fVar124 && (fVar124 < local_328)))) goto LAB_0017aa69;
                      goto LAB_0017ab1e;
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (scanline_00,(int)fVar132,psVar94,local_328,fVar123,fVar124,fVar129);
                    fVar128 = fVar129;
                    fVar131 = fVar124;
                    fVar120 = (float)local_498;
                    fVar127 = (float)local_4b8;
                  }
                  stbtt__handle_clipped_edge
                            (scanline_00,(int)fVar132,psVar94,fVar131,fVar128,fVar120,fVar127);
                  fVar120 = (float)local_4b8;
                  fVar127 = (float)local_498;
                }
                else {
                  stbtt__handle_clipped_edge
                            (scanline_00,(int)fVar132,psVar94,local_328,fVar123,fVar120,fVar127);
                  fVar120 = (float)local_4b8;
                  fVar127 = (float)local_498;
LAB_0017aa69:
                  stbtt__handle_clipped_edge
                            (scanline_00,(int)fVar132,psVar94,fVar127,fVar120,fVar124,fVar129);
                  fVar120 = fVar129;
                  fVar127 = fVar124;
                }
LAB_0017ab1e:
                stbtt__handle_clipped_edge
                          (scanline_00,(int)fVar132,psVar94,fVar127,fVar120,fVar133,fVar107);
                fVar132 = (float)((int)fVar132 + 1);
              }
            }
            else if (fVar132 < local_44c) {
              if (0.0 <= fVar132) {
                uStack_324 = 0;
                uStack_320 = 0;
                uStack_31c = 0;
                local_328 = fVar132;
                stbtt__handle_clipped_edge
                          (scanline_00,(int)fVar132,psVar94,fVar132,fVar123,fVar132,fVar107);
                iVar80 = (int)fVar132 + 1;
                fVar132 = local_328;
              }
              else {
                iVar80 = 0;
              }
              stbtt__handle_clipped_edge(scanline,iVar80,psVar94,fVar132,fVar123,fVar132,fVar107);
            }
LAB_0017ad85:
          }
        }
        fVar123 = 0.0;
        lVar71 = local_300;
        pfVar79 = scanline_00;
        iVar80 = iVar57;
        while (bVar105 = lVar71 != 0, lVar71 = lVar71 + -1, bVar105) {
          fVar123 = fVar123 + pfVar79[local_2d0];
          iVar70 = (int)(ABS(*pfVar79 + fVar123) * 255.0 + 0.5);
          if (0xfe < iVar70) {
            iVar70 = 0xff;
          }
          local_2c8[iVar80] = (uchar)iVar70;
          iVar80 = iVar80 + 1;
          pfVar79 = pfVar79 + 1;
        }
        psVar68 = &charstrings;
        while (psVar68 = *(stbtt_uint32 **)psVar68, psVar68 != (stbtt_uint32 *)0x0) {
          psVar68[2] = (stbtt_uint32)((float)psVar68[3] + (float)psVar68[2]);
        }
        uVar76 = (ulong)((int)uVar76 + 1);
        iVar57 = iVar57 + local_4c0;
      }
      while (local_3c8 != (undefined8 *)0x0) {
        puVar66 = (undefined8 *)*local_3c8;
        ImGui::MemFree(local_3c8);
        local_3c8 = puVar66;
      }
      if (scanline_00 != (float *)&x0) {
        ImGui::MemFree(scanline_00);
      }
      ImGui::MemFree(p);
    }
    ImGui::MemFree(ptr_00);
    ImGui::MemFree(local_460);
  }
LAB_0017aeb1:
  ImGui::MemFree((void *)CONCAT44(uStack_454,fdarrayoff));
  iVar57 = psVar15[lVar99].x;
  iVar58 = psVar15[lVar99].y;
  uVar5._0_4_ = psVar15[lVar99].w;
  uVar5._4_4_ = psVar15[lVar99].h;
  if (1 < (byte)local_330) {
    puVar104 = puVar63 + (long)(iVar58 * local_4c0) + (long)iVar57;
    x0 = 0;
    uStack_234 = 0;
    iVar59 = (undefined4)uVar5 - uVar84;
    iVar70 = 0;
    iVar80 = uVar5._4_4_;
    if ((int)uVar5._4_4_ < 1) {
      iVar80 = iVar70;
    }
    local_4b8 = (ushort *)CONCAT44(local_4b8._4_4_,iVar80);
    if (iVar59 < 0) {
      iVar59 = -1;
    }
    puVar101 = local_308 + (long)iVar59 + (long)iVar57 + (long)(iVar58 * local_4c0);
    lVar71 = (long)iVar59 + 1;
    for (; uVar76 = local_330, (float)iVar70 != (float)local_4b8; iVar70 = iVar70 + 1) {
      memset(&x0,0,local_330);
      puVar88 = puVar101;
      lVar78 = lVar71;
      switch((int)uVar76) {
      case 2:
        uVar76 = 0;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = puVar104[lVar87];
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar87 + 2 & 7)) = bVar11;
          uVar98 = (int)uVar76 + ((uint)bVar11 - (uint)bVar12);
          uVar76 = (ulong)uVar98;
          puVar104[lVar87] = (uchar)(uVar98 >> 1);
        }
        break;
      case 3:
        uVar76 = 0;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = puVar104[lVar87];
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar87 + 3 & 7)) = bVar11;
          uVar76 = (ulong)((int)uVar76 + ((uint)bVar11 - (uint)bVar12));
          puVar104[lVar87] = (uchar)(uVar76 / 3);
        }
        break;
      case 4:
        uVar76 = 0;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = puVar104[lVar87];
          uVar64 = (ulong)((uint)lVar87 & 7);
          *(byte *)((long)&x0 + (uVar64 ^ 4)) = bVar11;
          uVar98 = (int)uVar76 + ((uint)bVar11 - (uint)*(byte *)((long)&x0 + uVar64));
          uVar76 = (ulong)uVar98;
          puVar104[lVar87] = (uchar)(uVar98 >> 2);
        }
        break;
      case 5:
        uVar76 = 0;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = puVar104[lVar87];
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar87 + 5 & 7)) = bVar11;
          uVar76 = (ulong)((int)uVar76 + ((uint)bVar11 - (uint)bVar12));
          puVar104[lVar87] = (uchar)(uVar76 / 5);
        }
        break;
      default:
        uVar76 = 0;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = puVar104[lVar87];
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar84 + (uint)lVar87 & 7)) = bVar11;
          uVar98 = (int)uVar76 + ((uint)bVar11 - (uint)bVar12);
          uVar76 = (ulong)uVar98;
          puVar104[lVar87] = (uchar)(uVar98 / uVar84);
        }
      }
      for (; lVar78 < (int)(undefined4)uVar5; lVar78 = lVar78 + 1) {
        uVar98 = (int)uVar76 - (uint)*(byte *)((long)&x0 + (ulong)((uint)lVar78 & 7));
        uVar76 = (ulong)uVar98;
        *puVar88 = (uchar)(uVar98 / uVar84);
        puVar88 = puVar88 + 1;
      }
      puVar104 = puVar104 + lVar61;
      puVar101 = puVar101 + lVar61;
    }
    iVar57 = psVar15[lVar99].x;
    iVar58 = psVar15[lVar99].y;
    uVar5._0_4_ = psVar15[lVar99].w;
    uVar5._4_4_ = psVar15[lVar99].h;
  }
  if (1 < (byte)local_338) {
    pbVar85 = puVar63 + (long)(iVar58 * local_4c0) + (long)iVar57;
    iVar116 = (int)((ulong)uVar5 >> 0x20);
    x0 = 0;
    uStack_234 = 0;
    iVar59 = iVar116 - (uint)uVar113;
    iVar70 = 0;
    iVar80 = (int)uVar5;
    if ((int)uVar5 < 1) {
      iVar80 = iVar70;
    }
    if (iVar59 < 0) {
      iVar59 = -1;
    }
    lVar71 = (long)iVar59 + 1;
    puVar104 = puVar63 + lVar61 * lVar71 + (long)iVar57 + (long)(iVar58 * local_4c0);
    for (; uVar76 = local_338, iVar70 != iVar80; iVar70 = iVar70 + 1) {
      memset(&x0,0,local_338);
      puVar101 = puVar104;
      lVar78 = lVar71;
      switch((int)uVar76) {
      case 2:
        uVar76 = 0;
        pbVar91 = pbVar85;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = *pbVar91;
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar87 + 2 & 7)) = bVar11;
          uVar98 = (int)uVar76 + ((uint)bVar11 - (uint)bVar12);
          uVar76 = (ulong)uVar98;
          *pbVar91 = (byte)(uVar98 >> 1);
          pbVar91 = pbVar91 + lVar61;
        }
        break;
      case 3:
        uVar76 = 0;
        pbVar91 = pbVar85;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = *pbVar91;
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar87 + 3 & 7)) = bVar11;
          uVar76 = (ulong)((int)uVar76 + ((uint)bVar11 - (uint)bVar12));
          *pbVar91 = (byte)(uVar76 / 3);
          pbVar91 = pbVar91 + lVar61;
        }
        break;
      case 4:
        uVar76 = 0;
        pbVar91 = pbVar85;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = *pbVar91;
          uVar64 = (ulong)((uint)lVar87 & 7);
          *(byte *)((long)&x0 + (uVar64 ^ 4)) = bVar11;
          uVar98 = (int)uVar76 + ((uint)bVar11 - (uint)*(byte *)((long)&x0 + uVar64));
          uVar76 = (ulong)uVar98;
          *pbVar91 = (byte)(uVar98 >> 2);
          pbVar91 = pbVar91 + lVar61;
        }
        break;
      case 5:
        uVar76 = 0;
        pbVar91 = pbVar85;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = *pbVar91;
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)lVar87 + 5 & 7)) = bVar11;
          uVar76 = (ulong)((int)uVar76 + ((uint)bVar11 - (uint)bVar12));
          *pbVar91 = (byte)(uVar76 / 5);
          pbVar91 = pbVar91 + lVar61;
        }
        break;
      default:
        uVar76 = 0;
        pbVar91 = pbVar85;
        for (lVar87 = 0; lVar71 != lVar87; lVar87 = lVar87 + 1) {
          bVar11 = *pbVar91;
          bVar12 = *(byte *)((long)&x0 + (ulong)((uint)lVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar113 + (uint)lVar87 & 7)) = bVar11;
          uVar76 = (ulong)((int)uVar76 + ((uint)bVar11 - (uint)bVar12));
          *pbVar91 = (byte)(uVar76 / uVar113);
          pbVar91 = pbVar91 + lVar61;
        }
      }
      for (; lVar78 < iVar116; lVar78 = lVar78 + 1) {
        uVar76 = (ulong)((int)uVar76 - (uint)*(byte *)((long)&x0 + (ulong)((uint)lVar78 & 7)));
        *puVar101 = (uchar)(uVar76 / uVar113);
        puVar101 = puVar101 + lVar61;
      }
      pbVar85 = pbVar85 + 1;
      puVar104 = puVar104 + 1;
    }
    iVar57 = psVar15[lVar99].x;
    iVar58 = psVar15[lVar99].y;
    uVar5._0_4_ = psVar15[lVar99].w;
    uVar5._4_4_ = psVar15[lVar99].h;
  }
  local_2e0->x0 = (unsigned_short)iVar57;
  local_2e0->y0 = (unsigned_short)iVar58;
  local_2e0->x1 = (short)uVar5 + (unsigned_short)iVar57;
  local_2e0->y1 = (short)((ulong)uVar5 >> 0x20) + (unsigned_short)iVar58;
  local_2e0->xadvance = (float)(int)CONCAT11(uVar9,uVar10) * local_2b8;
  local_2e0->xoff = (float)x0_1 * (float)local_278._0_4_ + (float)local_268._0_4_;
  local_2e0->yoff = (float)y0_1 * (float)local_278._4_4_ + (float)local_268._4_4_;
  local_2e0->xoff2 = (float)(x0_1 + (int)uVar5) * (float)local_278._0_4_ + (float)local_268._0_4_;
  local_2e0->yoff2 =
       (float)(y0_1 + (int)((ulong)uVar5 >> 0x20)) * (float)local_278._4_4_ + (float)local_268._4_4_
  ;
  if ((int)local_340 == 0) {
    uVar96 = uVar90;
  }
  uVar96 = uVar96 & 0xffffffff;
  pIVar81 = local_348;
  psVar102 = local_480;
LAB_0017b4ab:
  lVar99 = lVar99 + 1;
  uVar90 = uVar90 + 1;
  goto LAB_00179e19;
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            IM_ASSERT(0 && "stbtt_InitFont(): failed to parse FontData. It is correct and complete? Check FontDataSize.");
            return false;
        }

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
        {
            // Check for valid range. This may also help detect *some* dangling pointers, because a common
            // user error is to setup ImFontConfig::GlyphRanges with a pointer to data that isn't persistent.
            IM_ASSERT(src_range[0] <= src_range[1]);
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        }
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels * cfg.RasterizerDensity;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0.0f) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels * cfg.RasterizerDensity) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels * cfg.RasterizerDensity);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImCeil(unscaled_ascent * font_scale);
        const float descent = ImFloor(unscaled_descent * font_scale);
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        const float inv_rasterization_scale = 1.0f / cfg.RasterizerDensity;

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            float x0 = q.x0 * inv_rasterization_scale + font_off_x;
            float y0 = q.y0 * inv_rasterization_scale + font_off_y;
            float x1 = q.x1 * inv_rasterization_scale + font_off_x;
            float y1 = q.y1 * inv_rasterization_scale + font_off_y;
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, x0, y0, x1, y1, q.s0, q.t0, q.s1, q.t1, pc.xadvance * inv_rasterization_scale);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}